

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

StackSym * __thiscall Lowerer::GetTempNumberSym(Lowerer *this,Opnd *opnd,bool isTempTransferred)

{
  _func_int **pp_Var1;
  code *pcVar2;
  OpndKind OVar3;
  bool bVar4;
  undefined4 *puVar5;
  StackSym *stackSym;
  
  OVar3 = IR::Opnd::GetKind(opnd);
  if (OVar3 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2321,"(opnd->IsRegOpnd())","Expected regOpnd");
    if (!bVar4) goto LAB_005d64c6;
    *puVar5 = 0;
  }
  if (isTempTransferred) {
    stackSym = StackSym::New(TyMisc,this->m_func);
    Func::StackAllocate(this->m_func,stackSym,8);
  }
  else {
    OVar3 = IR::Opnd::GetKind(opnd);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) {
LAB_005d64c6:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    pp_Var1 = opnd[1]._vptr_Opnd;
    stackSym = (StackSym *)pp_Var1[6];
    if (stackSym == (StackSym *)0x0) {
      stackSym = StackSym::New(TyMisc,this->m_func);
      Func::StackAllocate(this->m_func,stackSym,8);
      pp_Var1[6] = (_func_int *)stackSym;
    }
  }
  return stackSym;
}

Assistant:

StackSym *
Lowerer::GetTempNumberSym(IR::Opnd * opnd, bool isTempTransferred)
{
    AssertMsg(opnd->IsRegOpnd(), "Expected regOpnd");

    if (isTempTransferred)
    {
        StackSym * tempNumberSym = StackSym::New(TyMisc, m_func);
        this->m_func->StackAllocate(tempNumberSym, sizeof(Js::JavascriptNumber));
        return tempNumberSym;
    }
    StackSym * stackSym = opnd->AsRegOpnd()->m_sym;
    StackSym * tempNumberSym = stackSym->m_tempNumberSym;

    if (tempNumberSym == nullptr)
    {
        tempNumberSym = StackSym::New(TyMisc, m_func);
        this->m_func->StackAllocate(tempNumberSym, sizeof(Js::JavascriptNumber));
        stackSym->m_tempNumberSym = tempNumberSym;
    }
    return tempNumberSym;
}